

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetoh.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__stream;
  FILE *__stream_00;
  char *__s;
  
  if (argc == 4) {
    __stream = fopen(argv[2],"r");
    if (__stream == (FILE *)0x0) {
      __s = "could not open input file";
    }
    else {
      __stream_00 = fopen(argv[3],"w");
      if (__stream_00 != (FILE *)0x0) {
        fprintf(__stream_00,"static char %s[] = {\n",argv[1]);
        uVar1 = fgetc(__stream);
        while (uVar1 != 0xffffffff) {
          fprintf(__stream_00,"%hhi,",(ulong)uVar1);
          uVar1 = fgetc(__stream);
        }
        fwrite("0\n};\n",5,1,__stream_00);
        fclose(__stream);
        fclose(__stream_00);
        return 0;
      }
      __s = "could not open output file";
    }
    perror(__s);
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char** argv) {
	if(argc != 4) {
		fprintf(stderr, "Usage: %s <resource_name> <infile> <outfile.h>\n", argv[0]);
		return 1;
	}

	FILE *in, *out;
	int c;

	in = fopen(argv[2], "r");
	if(in == NULL) {
		perror("could not open input file");
		return 1;
	}

	out = fopen(argv[3], "w");
	if(out == NULL) {
		perror("could not open output file");
		return 1;
	}

	fprintf(out, "static char %s[] = {\n", argv[1]);

	while((c = fgetc(in)) != EOF) {
		fprintf(out, "%hhi,", c);
	}

	fprintf(out, "0\n};\n");
	fclose(in);
	fclose(out);
	return 0;
}